

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.h
# Opt level: O2

int reader_lock(fdb_rw_lock *lock)

{
  FILE *__stream;
  uint __errnum;
  char *pcVar1;
  
  __errnum = pthread_rwlock_rdlock((pthread_rwlock_t *)lock);
  __stream = _stderr;
  if (__errnum != 0) {
    pcVar1 = strerror(__errnum);
    fprintf(__stream,"pthread_rwlock_rdlock returned %d (%s)\n",(ulong)__errnum,pcVar1);
  }
  return __errnum;
}

Assistant:

INLINE int reader_lock(fdb_rw_lock *lock) {
#if !defined(WIN32) && !defined(_WIN32)
    int result = pthread_rwlock_rdlock(lock);
    if (result != 0) {
        fprintf(stderr, "pthread_rwlock_rdlock returned %d (%s)\n",
                result, strerror(result));
    }
    return result;
#else
    AcquireSRWLockShared(lock);
    return 0;
#endif
}